

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O0

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::load_graph
          (Knn_Graph<L2Distance<float>_> *this,string *graph_index_path,string *graph_dist_path)

{
  GnnsException *this_00;
  exception *e;
  float *local_48;
  undefined8 local_30;
  uint *puStack_28;
  string *local_20;
  string *graph_dist_path_local;
  string *graph_index_path_local;
  Knn_Graph<L2Distance<float>_> *this_local;
  
  local_20 = graph_dist_path;
  graph_dist_path_local = graph_index_path;
  graph_index_path_local = (string *)this;
  load_from_file<unsigned_int>((gnns *)&local_30,graph_index_path);
  (this->indices).cols = (undefined4)local_30;
  (this->indices).rows = local_30._4_4_;
  (this->indices).data = puStack_28;
  load_from_file<float>((gnns *)&e,local_20);
  *(exception **)&this->distances = e;
  (this->distances).data = local_48;
  if (((this->indices).rows == (this->distances).rows) &&
     ((this->indices).cols == (this->distances).cols)) {
    this->k = (this->indices).cols;
    return;
  }
  this_00 = (GnnsException *)__cxa_allocate_exception(0x10);
  GnnsException::GnnsException(this_00,"Saved graph file error\n");
  __cxa_throw(this_00,&GnnsException::typeinfo,GnnsException::~GnnsException);
}

Assistant:

void load_graph(const std::string& graph_index_path, const std::string& graph_dist_path)
        {
            try{
                indices = load_from_file<IndexType>(graph_index_path);
                distances = load_from_file<DistanceType>(graph_dist_path);
                if(indices.rows != distances.rows || indices.cols != distances.cols)
                {
                    throw GnnsException("Saved graph file error\n");
                }
                k = indices.cols;
            }catch (std::exception& e){
                throw e;
            }
        }